

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

int __thiscall kj::anon_unknown_9::DiskHandle::stat(DiskHandle *this,char *__file,stat *__buf)

{
  int iVar1;
  Type TVar2;
  Fault f;
  stat stats;
  Fault local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  stat64 local_a8;
  
  do {
    iVar1 = fstat64(*(int *)__file,&local_a8);
    if (-1 < iVar1) goto LAB_001f726a;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_c0.exception = (Exception *)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    kj::_::Debug::Fault::init
              (&local_c0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_c0);
  }
LAB_001f726a:
  TVar2 = modeToType(local_a8.st_mode);
  (this->fd).fd = TVar2;
  *(__off_t *)(this + 2) = local_a8.st_size;
  *(__blkcnt64_t *)(this + 4) = local_a8.st_blocks << 9;
  *(__time_t *)(this + 6) = local_a8.st_mtim.tv_sec * 1000000000 + local_a8.st_mtim.tv_nsec;
  this[8].fd.fd = (int)local_a8.st_nlink;
  *(__dev_t *)(this + 10) = (local_a8.st_dev << 0x20 | local_a8.st_dev >> 0x20) ^ local_a8.st_ino;
  return (int)local_a8.st_nlink;
}

Assistant:

FsNode::Metadata stat() const {
    struct stat stats;
    KJ_SYSCALL(::fstat(fd, &stats));
    return statToMetadata(stats);
  }